

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ElseConstraintClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElseConstraintClauseSyntax,slang::parsing::Token&,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,Token *args,ConstraintItemSyntax *args_1)

{
  Token elseKeyword;
  ElseConstraintClauseSyntax *this_00;
  
  this_00 = (ElseConstraintClauseSyntax *)allocate(this,0x28,8);
  elseKeyword.kind = args->kind;
  elseKeyword._2_1_ = args->field_0x2;
  elseKeyword.numFlags.raw = (args->numFlags).raw;
  elseKeyword.rawLen = args->rawLen;
  elseKeyword.info = args->info;
  slang::syntax::ElseConstraintClauseSyntax::ElseConstraintClauseSyntax(this_00,elseKeyword,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }